

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPlot.cpp
# Opt level: O0

bool __thiscall
SVGChart::PlotDataContainer::CalculateXRange(PlotDataContainer *this,float *outXMin,float *outXMax)

{
  bool bVar1;
  uint uVar2;
  reference ppPVar3;
  long lVar4;
  float local_50;
  float local_4c;
  float theXMax;
  float theXMin;
  PlotDataBase *theXDataBase;
  __normal_iterator<SVGChart::PlotDataBase_*const_*,_std::vector<SVGChart::PlotDataBase_*,_std::allocator<SVGChart::PlotDataBase_*>_>_>
  local_38;
  const_iterator theI;
  bool theFirst;
  float *outXMax_local;
  float *outXMin_local;
  PlotDataContainer *this_local;
  
  theI._M_current._7_1_ = 1;
  *outXMin = 0.0;
  *outXMax = 0.0;
  local_38._M_current =
       (PlotDataBase **)
       std::vector<SVGChart::PlotDataBase_*,_std::allocator<SVGChart::PlotDataBase_*>_>::begin
                 (&this->mXDataList);
  do {
    theXDataBase = (PlotDataBase *)
                   std::vector<SVGChart::PlotDataBase_*,_std::allocator<SVGChart::PlotDataBase_*>_>
                   ::end(&this->mXDataList);
    bVar1 = __gnu_cxx::operator!=
                      (&local_38,
                       (__normal_iterator<SVGChart::PlotDataBase_*const_*,_std::vector<SVGChart::PlotDataBase_*,_std::allocator<SVGChart::PlotDataBase_*>_>_>
                        *)&theXDataBase);
    if (!bVar1) {
      if ((((*outXMin != 0.0) || (NAN(*outXMin))) || (*outXMax != 0.0)) || (NAN(*outXMax))) {
        this_local._7_1_ = true;
      }
      else {
        this_local._7_1_ = false;
      }
      return this_local._7_1_;
    }
    ppPVar3 = __gnu_cxx::
              __normal_iterator<SVGChart::PlotDataBase_*const_*,_std::vector<SVGChart::PlotDataBase_*,_std::allocator<SVGChart::PlotDataBase_*>_>_>
              ::operator*(&local_38);
    _theXMax = *ppPVar3;
    if (_theXMax == (PlotDataBase *)0x0) {
      return false;
    }
    lVar4 = PlotDataBase::GetSize(_theXMax);
    if (lVar4 != 0) {
      uVar2 = (*_theXMax->_vptr_PlotDataBase[4])(_theXMax,&local_4c,&local_50);
      if ((uVar2 & 1) == 0) {
        return false;
      }
      if (local_50 < local_4c) {
        return false;
      }
      if ((theI._M_current._7_1_ & 1) != 0) {
        *outXMin = local_4c;
        *outXMax = local_50;
        theI._M_current._7_1_ = 0;
      }
      if (*outXMax <= local_50 && local_50 != *outXMax) {
        *outXMax = local_50;
      }
      if (local_4c < *outXMin) {
        *outXMin = local_4c;
      }
    }
    __gnu_cxx::
    __normal_iterator<SVGChart::PlotDataBase_*const_*,_std::vector<SVGChart::PlotDataBase_*,_std::allocator<SVGChart::PlotDataBase_*>_>_>
    ::operator++(&local_38,0);
  } while( true );
}

Assistant:

bool PlotDataContainer::CalculateXRange (float &outXMin, float &outXMax) const {
      bool theFirst = true;
      outXMin = 0;
      outXMax = 0;
      for (PlotDataList::const_iterator theI=mXDataList.begin();theI!=mXDataList.end ();theI++) {
        PlotDataBase *theXDataBase = *theI;
        if (!theXDataBase) {
          return false;
        }
        if (theXDataBase->GetSize () == 0) {
            continue;
        }
        float theXMin;
        float theXMax;
        if (!theXDataBase->CalculateRange (theXMin, theXMax)) {
          return false;
        }
        if (theXMax < theXMin) {
            return false;
        }
        if (theFirst) {
          outXMin = theXMin;
          outXMax = theXMax;
          theFirst = false;
        }
        if (theXMax>outXMax) {
          outXMax = theXMax;
        }
        if (theXMin<outXMin) {
          outXMin = theXMin;
        }
      }
      if (outXMin == 0 && outXMax == 0) {
          return false;
      }
      return true;
    }